

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_ExtensionsOnArena_Test::~ArenaTest_ExtensionsOnArena_Test
          (ArenaTest_ExtensionsOnArena_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, ExtensionsOnArena) {
  Arena arena;
  // Ensure no leaks.
  TestAllExtensions* message_ext = Arena::Create<TestAllExtensions>(&arena);
  message_ext->SetExtension(proto2_unittest::optional_int32_extension, 42);
  message_ext->SetExtension(proto2_unittest::optional_string_extension,
                            std::string("test"));
  message_ext
      ->MutableExtension(proto2_unittest::optional_nested_message_extension)
      ->set_bb(42);
}